

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::simplifyRoundingsAndConversions(OptimizeInstructions *this,Unary *curr)

{
  UnaryOp UVar1;
  Expression *pEVar2;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  matcher;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  matcher_00;
  Matcher<wasm::Unary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::UnaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  matcher_01;
  bool bVar3;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *in_RCX;
  Unary *local_d8 [2];
  Matcher<wasm::Unary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::UnaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_c8;
  Expression *local_98;
  Unary *inner;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_80;
  undefined1 local_60 [8];
  Expression *x_1;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_48;
  undefined1 local_28 [8];
  Expression *x;
  Unary *curr_local;
  OptimizeInstructions *this_local;
  
  UVar1 = curr->op;
  x = (Expression *)curr;
  curr_local = (Unary *)this;
  if (UVar1 - CeilFloat32 < 8) {
    pEVar2 = curr->value;
    local_d8[0] = (Unary *)Match::any();
    Match::unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
              (&local_c8,(Match *)&local_98,local_d8,in_RCX);
    matcher_01._8_8_ = local_c8._8_8_;
    matcher_01.binder = local_c8.binder;
    matcher_01.submatchers.curr.binder = local_c8.submatchers.curr.binder;
    matcher_01.submatchers.curr._8_8_ = local_c8.submatchers.curr._8_8_;
    matcher_01.submatchers.next.curr = local_c8.submatchers.next.curr;
    matcher_01.submatchers.next._8_8_ = local_c8.submatchers.next._8_8_;
    bVar3 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Unary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::UnaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                      (pEVar2,matcher_01);
    if (!bVar3) {
      return (Expression *)0x0;
    }
    if (7 < *(int *)(local_98 + 1) - 0x23U) {
      return (Expression *)0x0;
    }
    return local_98;
  }
  if (UVar1 == TruncSFloat64ToInt32) {
LAB_01f7ea19:
    pEVar2 = curr->value;
    x_1 = (Expression *)
          Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_28,
                     (Expression **)curr);
    Match::unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
              (&local_48,(Match *)0x24,(UnaryOp)&x_1,in_RCX);
    matcher.data = local_48.data;
    matcher._12_4_ = local_48._12_4_;
    matcher.binder = local_48.binder;
    matcher.submatchers.curr = local_48.submatchers.curr;
    matcher.submatchers._8_8_ = local_48.submatchers._8_8_;
    bVar3 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                      (pEVar2,matcher);
    if (bVar3) {
      return (Expression *)local_28;
    }
  }
  else {
    if (UVar1 != TruncUFloat64ToInt32) {
      if (UVar1 == TruncSatSFloat64ToInt32) goto LAB_01f7ea19;
      if (UVar1 != TruncSatUFloat64ToInt32) {
        return (Expression *)0x0;
      }
    }
    pEVar2 = curr->value;
    inner = (Unary *)Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                                local_60,(Expression **)curr);
    Match::unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
              (&local_80,(Match *)0x26,(UnaryOp)&inner,in_RCX);
    matcher_00.data = local_80.data;
    matcher_00._12_4_ = local_80._12_4_;
    matcher_00.binder = local_80.binder;
    matcher_00.submatchers.curr = local_80.submatchers.curr;
    matcher_00.submatchers._8_8_ = local_80.submatchers._8_8_;
    bVar3 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                      (pEVar2,matcher_00);
    if (bVar3) {
      return (Expression *)local_60;
    }
  }
  return (Expression *)0x0;
}

Assistant:

Expression* simplifyRoundingsAndConversions(Unary* curr) {
    using namespace Abstract;
    using namespace Match;

    switch (curr->op) {
      case TruncSFloat64ToInt32:
      case TruncSatSFloat64ToInt32: {
        // i32 -> f64 -> i32 rountripping optimization:
        //   i32.trunc(_sat)_f64_s(f64.convert_i32_s(x))  ==>  x
        Expression* x;
        if (matches(curr->value, unary(ConvertSInt32ToFloat64, any(&x)))) {
          return x;
        }
        break;
      }
      case TruncUFloat64ToInt32:
      case TruncSatUFloat64ToInt32: {
        // u32 -> f64 -> u32 rountripping optimization:
        //   i32.trunc(_sat)_f64_u(f64.convert_i32_u(x))  ==>  x
        Expression* x;
        if (matches(curr->value, unary(ConvertUInt32ToFloat64, any(&x)))) {
          return x;
        }
        break;
      }
      case CeilFloat32:
      case CeilFloat64:
      case FloorFloat32:
      case FloorFloat64:
      case TruncFloat32:
      case TruncFloat64:
      case NearestFloat32:
      case NearestFloat64: {
        // Rounding after integer to float conversion may be skipped
        //   ceil(float(int(x)))     ==>  float(int(x))
        //   floor(float(int(x)))    ==>  float(int(x))
        //   trunc(float(int(x)))    ==>  float(int(x))
        //   nearest(float(int(x)))  ==>  float(int(x))
        Unary* inner;
        if (matches(curr->value, unary(&inner, any()))) {
          switch (inner->op) {
            case ConvertSInt32ToFloat32:
            case ConvertSInt32ToFloat64:
            case ConvertUInt32ToFloat32:
            case ConvertUInt32ToFloat64:
            case ConvertSInt64ToFloat32:
            case ConvertSInt64ToFloat64:
            case ConvertUInt64ToFloat32:
            case ConvertUInt64ToFloat64: {
              return inner;
            }
            default: {
            }
          }
        }
        break;
      }
      default: {
      }
    }
    return nullptr;
  }